

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O0

void __thiscall outlier_fn::outlier_fn(outlier_fn *this,outlier_fn *param_1)

{
  outlier_fn *param_1_local;
  outlier_fn *this_local;
  
  std::shared_ptr<std::random_device>::shared_ptr(&this->rd,&param_1->rd);
  return;
}

Assistant:

auto operator () (Container c)
    {
        if (c.size() > 1)
        {
            std::sort(c.begin(), c.end());

            std::default_random_engine engine((*rd)());
            const auto max_outlier_index = std::distance(c.begin(), c.end()) - 2;
            using difference_type = typename Container::difference_type;
            auto uniform = std::uniform_int_distribution<difference_type>(0, max_outlier_index);
            auto outlier_index = uniform(engine);
            std::rotate(c.begin() + outlier_index, c.end() - 1, c.end());
        }
        return c;
    }